

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall ParseResult::ParseResult(ParseResult *this,string *s)

{
  this->result = ERROR;
  (this->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->error,(string *)s);
  return;
}

Assistant:

explicit ParseResult(const std::string &s): result(parse_result_t::ERROR), node(nullptr), error(s) {}